

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix
          (TPZFNMatrix<3,_Fad<float>_> *this,int64_t row,int64_t col,Fad<float> *val)

{
  TPZFMatrix<Fad<float>_> *pTVar1;
  Fad<float> *in_RCX;
  int64_t in_RDX;
  int64_t in_RSI;
  TPZFMatrix<Fad<float>_> *in_RDI;
  TPZFMatrix<Fad<float>_> *unaff_retaddr;
  Fad<float> *in_stack_ffffffffffffff60;
  Fad<float> *in_stack_ffffffffffffff68;
  Fad<float> *in_stack_ffffffffffffff70;
  TPZFMatrix<Fad<float>_> *local_68;
  int64_t sz;
  TPZFMatrix<Fad<float>_> *pTVar2;
  
  sz = 0;
  pTVar2 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<3,Fad<float>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  (in_RDI->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0240fa18;
  TPZFMatrix<Fad<float>_>::TPZFMatrix(unaff_retaddr,(void **)pTVar2,in_RSI,in_RDX,in_RCX,sz);
  (in_RDI->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0240fa18;
  pTVar2 = in_RDI + 1;
  pTVar1 = in_RDI + 1;
  do {
    local_68 = pTVar1;
    Fad<float>::Fad(in_stack_ffffffffffffff70);
    pTVar1 = (TPZFMatrix<Fad<float>_> *)&local_68->fElem;
  } while (&local_68->fElem != (Fad<float> **)&(pTVar2->fWork).fNElements);
  Fad<float>::Fad(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  TPZFMatrix<Fad<float>_>::operator=(in_RDI,(Fad<float> *)local_68);
  Fad<float>::~Fad(in_stack_ffffffffffffff60);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }